

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Image::operator==(Image *this,Image *other)

{
  bool bVar1;
  __type _Var2;
  
  if (this->bufferView != other->bufferView) {
    return false;
  }
  if (((((this->component == other->component) &&
        (bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t), bVar1)) &&
       (bVar1 = Equals(&this->extras,&other->extras), bVar1)) &&
      ((this->height == other->height &&
       (bVar1 = std::operator==(&this->image,&other->image), bVar1)))) &&
     ((_Var2 = std::operator==(&this->mimeType,&other->mimeType), _Var2 &&
      ((_Var2 = std::operator==(&this->name,&other->name), _Var2 &&
       (_Var2 = std::operator==(&this->uri,&other->uri), _Var2)))))) {
    return this->width == other->width;
  }
  return false;
}

Assistant:

bool Image::operator==(const Image &other) const {
  return this->bufferView == other.bufferView &&
         this->component == other.component &&
         this->extensions == other.extensions && this->extras == other.extras &&
         this->height == other.height && this->image == other.image &&
         this->mimeType == other.mimeType && this->name == other.name &&
         this->uri == other.uri && this->width == other.width;
}